

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::PrintTestList(cmCTestMultiProcessHandler *this)

{
  uint uVar1;
  cmCTestTestHandler *pcVar2;
  cmCTestTestProperties *pcVar3;
  cmCTest *pcVar4;
  int iVar5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  undefined8 extraout_RDX;
  pointer pbVar9;
  undefined1 auVar10 [16];
  char *local_580 [4];
  _Rb_tree_node_base *local_560;
  _Rb_tree_node_base *local_558;
  string current_dir;
  ostringstream cmCTestLog_msg_5;
  long alStack_520 [45];
  ostringstream indexStr;
  cmCTestRunTest testRun;
  
  pcVar2 = this->TestHandler;
  iVar5 = FindMaxIndex(this);
  pcVar2->MaxIndex = iVar5;
  auVar10._8_8_ = extraout_RDX;
  auVar10._0_8_ =
       (this->Properties).
       super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
       ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_560 = &(this->Properties).
               super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ._M_t._M_impl.super__Rb_tree_header._M_header;
  while (p_Var7 = auVar10._0_8_, p_Var7 != local_560) {
    pcVar3 = (cmCTestTestProperties *)p_Var7[1]._M_parent;
    local_558 = p_Var7;
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&current_dir,(SystemTools *)0x1,auVar10[8]);
    cmsys::SystemTools::ChangeDirectory(&pcVar3->Directory);
    cmCTestRunTest::cmCTestRunTest(&testRun,this->TestHandler);
    testRun.Index = pcVar3->Index;
    testRun.TestProperties = pcVar3;
    cmCTestRunTest::ComputeArguments(&testRun);
    pbVar9 = (pcVar3->Labels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar9 != (pcVar3->Labels).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      std::operator<<((ostream *)&indexStr,"Labels:");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x317,_cmCTestLog_msg_5,this->Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
      pbVar9 = (pcVar3->Labels).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; pbVar9 != (pcVar3->Labels).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      poVar6 = std::operator<<((ostream *)&indexStr," ");
      std::operator<<(poVar6,(string *)pbVar9);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x31d,_cmCTestLog_msg_5,this->Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    }
    if (pbVar9 != (pcVar3->Labels).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      std::endl<char,std::char_traits<char>>((ostream *)&indexStr);
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x322,_cmCTestLog_msg_5,this->Quiet);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    }
    if (this->TestHandler->MemCheck == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      std::operator<<((ostream *)&indexStr,"  Memory Check");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x328,_cmCTestLog_msg_5,this->Quiet);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
      std::operator<<((ostream *)&indexStr,"  Test");
      pcVar4 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar4,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                   ,0x32c,_cmCTestLog_msg_5,this->Quiet);
    }
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_5);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&indexStr);
    poVar6 = std::operator<<((ostream *)&indexStr," #");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,pcVar3->Index);
    std::operator<<(poVar6,":");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
    uVar1 = this->TestHandler->MaxIndex;
    lVar8 = 5 - (ulong)(uVar1 < 10);
    if (99 < uVar1) {
      lVar8 = 6;
    }
    *(long *)((long)alStack_520 + *(long *)(_cmCTestLog_msg_5 + -0x18)) = lVar8;
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)&cmCTestLog_msg_5,(string *)local_580);
    std::__cxx11::string::~string((string *)local_580);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x332,local_580[0],this->Quiet);
    std::__cxx11::string::~string((string *)local_580);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
    std::operator<<((ostream *)&cmCTestLog_msg_5," ");
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x333,local_580[0],this->Quiet);
    std::__cxx11::string::~string((string *)local_580);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_5);
    poVar6 = std::operator<<((ostream *)&cmCTestLog_msg_5,(pcVar3->Name)._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>(poVar6);
    pcVar4 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar4,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x335,local_580[0],this->Quiet);
    std::__cxx11::string::~string((string *)local_580);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_5);
    cmsys::SystemTools::ChangeDirectory(&current_dir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indexStr);
    cmCTestRunTest::~cmCTestRunTest(&testRun);
    std::__cxx11::string::~string((string *)&current_dir);
    auVar10 = std::_Rb_tree_increment(local_558);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&testRun);
  poVar6 = std::endl<char,std::char_traits<char>>((ostream *)&testRun);
  poVar6 = std::operator<<(poVar6,"Total Tests: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::endl<char,std::char_traits<char>>(poVar6);
  pcVar4 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar4,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x33b,_indexStr,this->Quiet);
  std::__cxx11::string::~string((string *)&indexStr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&testRun);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::PrintTestList()
{
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());
  int count = 0;

  for (PropertiesMap::iterator it = this->Properties.begin();
       it != this->Properties.end(); ++it)
    {
    count++;
    cmCTestTestHandler::cmCTestTestProperties& p = *it->second;

    //push working dir
    std::string current_dir = cmSystemTools::GetCurrentWorkingDirectory();
    cmSystemTools::ChangeDirectory(p.Directory);

    cmCTestRunTest testRun(this->TestHandler);
    testRun.SetIndex(p.Index);
    testRun.SetTestProperties(&p);
    testRun.ComputeArguments(); //logs the command in verbose mode

    if(!p.Labels.empty()) //print the labels
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Labels:",
        this->Quiet);
      }
    for(std::vector<std::string>::iterator label = p.Labels.begin();
        label != p.Labels.end(); ++label)
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, " " << *label,
        this->Quiet);
      }
    if(!p.Labels.empty()) //print the labels
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, std::endl,
        this->Quiet);
      }

    if (this->TestHandler->MemCheck)
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Memory Check",
        this->Quiet);
      }
     else
      {
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "  Test", this->Quiet);
      }
    std::ostringstream indexStr;
    indexStr << " #" << p.Index << ":";
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
      std::setw(3 + getNumWidth(this->TestHandler->GetMaxIndex()))
      << indexStr.str(), this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, " ", this->Quiet);
    cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
      p.Name.c_str() << std::endl, this->Quiet);
    //pop working dir
    cmSystemTools::ChangeDirectory(current_dir);
    }

  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, std::endl << "Total Tests: "
    << this->Total << std::endl, this->Quiet);
}